

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetWriter::SetWrittenStatistics
          (ParquetWriter *this,CopyFunctionFileStatistics *written_stats_p)

{
  pointer puVar1;
  ParquetColumnSchema *schema;
  __uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  __p;
  pointer pCVar2;
  pointer unifiers;
  pointer this_00;
  string local_58;
  __uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  local_38;
  
  (this->written_stats).ptr = written_stats_p;
  make_uniq<duckdb::ParquetStatsAccumulator>();
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  .super__Head_base<0UL,_duckdb::ParquetStatsAccumulator_*,_false>._M_head_impl =
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
       .super__Head_base<0UL,_duckdb::ParquetStatsAccumulator_*,_false>._M_head_impl;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  .super__Head_base<0UL,_duckdb::ParquetStatsAccumulator_*,_false>._M_head_impl =
       (tuple<duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
        )(_Tuple_impl<0UL,_duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
          )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  ::reset((__uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
           *)&this->stats_accumulator,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParquetStatsAccumulator_*,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
                   .super__Head_base<0UL,_duckdb::ParquetStatsAccumulator_*,_false>._M_head_impl);
  ::std::
  unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  ::~unique_ptr((unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
                 *)&local_38);
  puVar1 = (this->column_writers).
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->column_writers).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pCVar2 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
             operator->(this_00);
    schema = pCVar2->column_schema;
    unifiers = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
               ::operator->(&this->stats_accumulator);
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    GetStatsUnifier(schema,&unifiers->stats_unifiers,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void ParquetWriter::SetWrittenStatistics(CopyFunctionFileStatistics &written_stats_p) {
	written_stats = written_stats_p;
	stats_accumulator = make_uniq<ParquetStatsAccumulator>();
	// create the per-column stats unifiers
	for (auto &column_writer : column_writers) {
		GetStatsUnifier(column_writer->Schema(), stats_accumulator->stats_unifiers);
	}
}